

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall
BackwardPass::ProcessBailOnNoProfile(BackwardPass *this,Instr *instr,BasicBlock *block)

{
  code *pcVar1;
  FlowEdge **ppFVar2;
  bool bVar3;
  RegionType RVar4;
  IRKind IVar5;
  uint uVar6;
  undefined4 *puVar7;
  LabelInstr *pLVar8;
  Instr *pIVar9;
  Opnd *pOVar10;
  RegOpnd *pRVar11;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar12;
  Type_conflict pSVar13;
  Type *ppFVar14;
  BasicBlock *this_00;
  LabelInstr *this_01;
  Region *pRVar15;
  BasicBlock *pBVar16;
  Instr *instr_00;
  BranchInstr *pBVar17;
  bool local_f9;
  bool local_e9;
  bool setLastInstr;
  Instr *instrCopy;
  Instr *predInstr;
  BasicBlock *predSucc;
  FlowEdge **__edge_1;
  Iterator __iter_1;
  bool hoistBailToPred;
  BasicBlock *pred;
  FlowEdge **__edge;
  Iterator __iter;
  Instr *instrNope;
  Instr *curNext;
  LabelInstr *blockHeadInstr;
  Instr *insertionPointForGenerator;
  Instr *curInstr;
  BasicBlock *block_local;
  Instr *instr_local;
  BackwardPass *this_local;
  
  if (this->tag != BackwardPhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2085,"(this->tag == Js::BackwardPhase)","this->tag == Js::BackwardPhase");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (instr->m_opcode != BailOnNoProfile) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2086,"(instr->m_opcode == Js::OpCode::BailOnNoProfile)",
                       "instr->m_opcode == Js::OpCode::BailOnNoProfile");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = IR::Instr::HasBailOutInfo(instr);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2087,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (block == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x2088,"(block)","block");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar3 = IsPrePass(this);
  if (bVar3) {
    this_local._7_1_ = false;
  }
  else if ((this->currentRegion == (Region *)0x0) ||
          ((RVar4 = Region::GetType(this->currentRegion), RVar4 != RegionTypeCatch &&
           (RVar4 = Region::GetType(this->currentRegion), RVar4 != RegionTypeFinally)))) {
    insertionPointForGenerator = instr->m_prev;
    IVar5 = IR::Instr::GetKind(insertionPointForGenerator);
    local_e9 = true;
    if (IVar5 != InstrKindLabel) {
      local_e9 = IR::Instr::IsProfiledLabelInstr(insertionPointForGenerator);
    }
    if ((local_e9 == false) ||
       (pLVar8 = IR::Instr::AsLabelInstr(insertionPointForGenerator),
       ((byte)pLVar8->field_0x78 >> 1 & 1) == 0)) {
      blockHeadInstr = (LabelInstr *)0x0;
      while (bVar3 = IR::Instr::StartsBasicBlock(insertionPointForGenerator),
            ((bVar3 ^ 0xffU) & 1) != 0) {
        bVar3 = IR::Instr::DontHoistBailOnNoProfileAboveInGeneratorFunction
                          (insertionPointForGenerator);
        if (bVar3) {
          if (blockHeadInstr != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x20ab,"(insertionPointForGenerator == nullptr)",
                               "insertionPointForGenerator == nullptr");
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          blockHeadInstr = (LabelInstr *)insertionPointForGenerator;
        }
        if (((((insertionPointForGenerator->m_opcode == InlineeEnd) ||
              (insertionPointForGenerator->m_opcode == InlineBuiltInEnd)) ||
             (insertionPointForGenerator->m_opcode == InlineNonTrackingBuiltInEnd)) ||
            ((insertionPointForGenerator->m_opcode == InlineeStart ||
             (insertionPointForGenerator->m_opcode == EndCallForPolymorphicInlinee)))) ||
           ((bVar3 = OpCodeAttr::CallInstr(insertionPointForGenerator->m_opcode), bVar3 &&
            (insertionPointForGenerator->m_prev->m_opcode != BailOnNoProfile)))) break;
        insertionPointForGenerator = insertionPointForGenerator->m_prev;
      }
      IVar5 = IR::Instr::GetKind(insertionPointForGenerator);
      local_f9 = true;
      if (IVar5 != InstrKindLabel) {
        local_f9 = IR::Instr::IsProfiledLabelInstr(insertionPointForGenerator);
      }
      if (local_f9 == false) {
        BasicBlock::RemoveInstr(block,instr);
        this_local._7_1_ = true;
      }
      else {
        pLVar8 = IR::Instr::AsLabelInstr(insertionPointForGenerator);
        pIVar9 = IR::Instr::GetNextRealInstrOrLabel(insertionPointForGenerator);
        __iter.current = (NodeBase *)0x0;
        if (pIVar9->m_opcode == Ld_A) {
          pOVar10 = IR::Instr::GetDst(pIVar9);
          bVar3 = IR::Opnd::IsRegOpnd(pOVar10);
          if (bVar3) {
            pOVar10 = IR::Instr::GetDst(pIVar9);
            pRVar11 = IR::Opnd::AsRegOpnd(pOVar10);
            if (((byte)pRVar11->field_0x18 >> 3 & 1) != 0) {
              BasicBlock::RemoveInstr(block,instr);
              return true;
            }
          }
        }
        for (insertionPointForGenerator = instr->m_prev;
            bVar3 = IR::Instr::StartsBasicBlock(insertionPointForGenerator),
            !bVar3 && insertionPointForGenerator != (Instr *)__iter.current;
            insertionPointForGenerator = insertionPointForGenerator->m_prev) {
          if (insertionPointForGenerator->m_opcode == BailOnNoProfile) {
            bVar3 = IR::Instr::HasBailOutInfo(insertionPointForGenerator);
            if (bVar3) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x20e4,"(!curInstr->HasBailOutInfo())",
                                 "!curInstr->HasBailOutInfo()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            insertionPointForGenerator = insertionPointForGenerator->m_next;
            IR::Instr::Remove(insertionPointForGenerator->m_prev);
          }
        }
        pIVar9 = BasicBlock::GetLastInstr(block);
        if (instr == pIVar9) {
          BasicBlock::SetLastInstr(block,instr->m_prev);
        }
        IR::Instr::Unlink(instr);
        pSVar12 = &BasicBlock::GetPredList(block)->
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar12);
        while( true ) {
          do {
            if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            ppFVar2 = __edge;
            pSVar13 = SListNodeBase<Memory::ArenaAllocator>::Next
                                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            bVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                              ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar2,
                               pSVar13);
            if (bVar3) goto LAB_004ddaf0;
            SListNodeBase<Memory::ArenaAllocator>::Next
                      (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            ppFVar14 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 ((Iterator *)&__edge);
            this_00 = FlowEdge::GetPred(*ppFVar14);
            if (this_00 == (BasicBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x20f3,"(pred)","pred");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            __iter_1.current._7_1_ = blockHeadInstr == (LabelInstr *)0x0;
          } while (((*(ushort *)&block->field_0x18 >> 2 & 1) != 0) && (this_00->loop == block->loop)
                  );
          pIVar9 = BasicBlock::GetFirstInstr(this_00);
          this_01 = IR::Instr::AsLabelInstr(pIVar9);
          pRVar15 = IR::LabelInstr::GetRegion(this_01);
          if (pRVar15 != this->currentRegion) break;
          pSVar12 = &BasicBlock::GetSuccList(this_00)->
                     super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
          ___edge_1 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(pSVar12)
          ;
          do {
            if (__iter_1.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                 ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
            ppFVar2 = __edge_1;
            pSVar13 = SListNodeBase<Memory::ArenaAllocator>::Next
                                (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            bVar3 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                              ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)ppFVar2,
                               pSVar13);
            if (bVar3) goto LAB_004dd9d0;
            SListNodeBase<Memory::ArenaAllocator>::Next
                      (&(__iter_1.list)->super_SListNodeBase<Memory::ArenaAllocator>);
            ppFVar14 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                                 ((Iterator *)&__edge_1);
            pBVar16 = FlowEdge::GetSucc(*ppFVar14);
            if (pBVar16 == (BasicBlock *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x2105,"(predSucc)","predSucc");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
          } while ((pBVar16 == block) || ((*(ushort *)&pBVar16->field_0x18 >> 7 & 1) != 0));
          __iter_1.current._7_1_ = 0;
LAB_004dd9d0:
          if ((__iter_1.current._7_1_ & 1) != 0) {
            pIVar9 = BasicBlock::GetLastInstr(this_00);
            instr_00 = IR::Instr::Copy(instr,true);
            bVar3 = IR::Instr::EndsBasicBlock(pIVar9);
            if (bVar3) {
              if (pIVar9->m_prev->m_opcode == BailOnNoProfile) {
                IR::Instr::Free(instr_00);
              }
              else {
                bVar3 = IR::Instr::IsBranchInstr(pIVar9);
                if ((bVar3) &&
                   (pBVar17 = IR::Instr::AsBranchInstr(pIVar9),
                   ((byte)pBVar17->field_0x58 >> 1 & 1) == 0)) {
                  instr_00->m_func = pIVar9->m_func;
                  IR::Instr::InsertBefore(pIVar9,instr_00);
                }
              }
            }
            else if (pIVar9->m_opcode == BailOnNoProfile) {
              IR::Instr::Free(instr_00);
            }
            else {
              instr_00->m_func = pIVar9->m_func;
              IR::Instr::InsertAfter(pIVar9,instr_00);
              BasicBlock::SetLastInstr(this_00,instr_00);
            }
          }
        }
LAB_004ddaf0:
        uVar6 = BasicBlock::GetBlockNum(block);
        if (uVar6 == 0) {
          IR::Instr::Free(instr);
          this_local._7_1_ = true;
        }
        else {
          pLVar8->field_0x78 = pLVar8->field_0x78 & 0xfd | 2;
          pLVar8->field_0x78 = pLVar8->field_0x78 & 0xdf | 0x20;
          instr->m_func = insertionPointForGenerator->m_func;
          if (blockHeadInstr == (LabelInstr *)0x0) {
            IR::Instr::InsertAfter(insertionPointForGenerator,instr);
            *(ushort *)&block->field_0x18 = *(ushort *)&block->field_0x18 & 0xff7f | 0x80;
          }
          else {
            IR::Instr::InsertAfter(&blockHeadInstr->super_Instr,instr);
            *(ushort *)&block->field_0x18 = *(ushort *)&block->field_0x18 & 0xff7f;
          }
          pIVar9 = BasicBlock::GetLastInstr(block);
          if (insertionPointForGenerator == pIVar9) {
            BasicBlock::SetLastInstr(block,instr);
          }
          bVar3 = DoMarkTempObjects(this);
          if (bVar3) {
            ObjectTemp::ProcessBailOnNoProfile(&block->tempObjectTracker->super_ObjectTemp,instr);
          }
          this_local._7_1_ = false;
        }
      }
    }
    else {
      bVar3 = DoMarkTempObjects(this);
      if (bVar3) {
        ObjectTemp::ProcessBailOnNoProfile(&block->tempObjectTracker->super_ObjectTemp,instr);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::ProcessBailOnNoProfile(IR::Instr *instr, BasicBlock *block)
{
    Assert(this->tag == Js::BackwardPhase);
    Assert(instr->m_opcode == Js::OpCode::BailOnNoProfile);
    Assert(!instr->HasBailOutInfo());
    AnalysisAssert(block);

    if (this->IsPrePass())
    {
        return false;
    }
    if (this->currentRegion && (this->currentRegion->GetType() == RegionTypeCatch || this->currentRegion->GetType() == RegionTypeFinally))
    {
        return false;
    }

    IR::Instr *curInstr = instr->m_prev;

    if (curInstr->IsLabelInstr() && curInstr->AsLabelInstr()->isOpHelper)
    {
        // Already processed

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }

    // For generator functions, we don't want to move the BailOutOnNoProfile
    // above certain instructions such as GeneratorResumeYield or
    // CreateInterpreterStackFrameForGenerator. This indicates the insertion
    // point for the BailOutOnNoProfile in such cases.
    IR::Instr *insertionPointForGenerator = nullptr;

    // Don't hoist if we see calls with profile data (recursive calls)
    while(!curInstr->StartsBasicBlock())
    {
        if (curInstr->DontHoistBailOnNoProfileAboveInGeneratorFunction())
        {
            Assert(insertionPointForGenerator == nullptr);
            insertionPointForGenerator = curInstr;
        }

        // If a function was inlined, it must have had profile info.
        if (curInstr->m_opcode == Js::OpCode::InlineeEnd || curInstr->m_opcode == Js::OpCode::InlineBuiltInEnd || curInstr->m_opcode == Js::OpCode::InlineNonTrackingBuiltInEnd
            || curInstr->m_opcode == Js::OpCode::InlineeStart || curInstr->m_opcode == Js::OpCode::EndCallForPolymorphicInlinee)
        {
            break;
        }
        else if (OpCodeAttr::CallInstr(curInstr->m_opcode))
        {
            if (curInstr->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
            {
                break;
            }
        }
        curInstr = curInstr->m_prev;
    }

    // Didn't get to the top of the block, delete this BailOnNoProfile.
    if (!curInstr->IsLabelInstr())
    {
        block->RemoveInstr(instr);
        return true;
    }

    // Save the head instruction for later use.
    IR::LabelInstr *blockHeadInstr = curInstr->AsLabelInstr();

    // We can't bail in the middle of a "tmp = CmEq s1, s2; BrTrue tmp" turned into a "BrEq s1, s2",
    // because the bailout wouldn't be able to restore tmp.
    IR::Instr *curNext = curInstr->GetNextRealInstrOrLabel();
    IR::Instr *instrNope = nullptr;
    if (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
    {
        block->RemoveInstr(instr);
        return true;
        /*while (curNext->m_opcode == Js::OpCode::Ld_A && curNext->GetDst()->IsRegOpnd() && curNext->GetDst()->AsRegOpnd()->m_fgPeepTmp)
        {
            // Instead of just giving up, we can be a little trickier. We can instead treat the tmp declaration(s) as a
            // part of the block prefix, and put the bailonnoprofile immediately after them. This has the added benefit
            // that we can still merge up blocks beginning with bailonnoprofile, even if they would otherwise not allow
            // us to, due to the fact that these tmp declarations would be pre-empted by the higher-level bailout.
            instrNope = curNext;
            curNext = curNext->GetNextRealInstrOrLabel();
        }*/
    }

    curInstr = instr->m_prev;

    // Move to top of block (but just below any fgpeeptemp lds).
    while(!curInstr->StartsBasicBlock() && curInstr != instrNope)
    {
        // Delete redundant BailOnNoProfile
        if (curInstr->m_opcode == Js::OpCode::BailOnNoProfile)
        {
            Assert(!curInstr->HasBailOutInfo());
            curInstr = curInstr->m_next;
            curInstr->m_prev->Remove();
        }
        curInstr = curInstr->m_prev;
    }

    if (instr == block->GetLastInstr())
    {
        block->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();

    // Now try to move this up the flowgraph to the predecessor blocks
    FOREACH_PREDECESSOR_BLOCK(pred, block)
    {
        // Don't hoist BailOnNoProfile up past blocks containing GeneratorResumeYield
        bool hoistBailToPred = (insertionPointForGenerator == nullptr);

        if (block->isLoopHeader && pred->loop == block->loop)
        {
            // Skip loop back-edges
            continue;
        }

        if (pred->GetFirstInstr()->AsLabelInstr()->GetRegion() != this->currentRegion)
        {
            break;
        }

        // If all successors of this predecessor start with a BailOnNoProfile, we should be
        // okay to hoist this bail to the predecessor.
        FOREACH_SUCCESSOR_BLOCK(predSucc, pred)
        {
            if (predSucc == block)
            {
                continue;
            }
            if (!predSucc->beginsBailOnNoProfile)
            {
                hoistBailToPred = false;
                break;
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (hoistBailToPred)
        {
            IR::Instr *predInstr = pred->GetLastInstr();
            IR::Instr *instrCopy = instr->Copy();


            if (predInstr->EndsBasicBlock())
            {
                if (predInstr->m_prev->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else if (predInstr->IsBranchInstr() && !predInstr->AsBranchInstr()->m_isSwitchBr)
                {
                    // Don't put a bailout in the middle of a switch dispatch sequence.
                    // The bytecode offsets are not in order, and it would lead to incorrect
                    // bailout info.
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertBefore(instrCopy);
                }
            }
            else
            {
                if (predInstr->m_opcode == Js::OpCode::BailOnNoProfile)
                {
                    // We already have one, we don't need a second.
                    instrCopy->Free();
                }
                else
                {
                    instrCopy->m_func = predInstr->m_func;
                    predInstr->InsertAfter(instrCopy);
                    pred->SetLastInstr(instrCopy);
                }
            }
        }
    } NEXT_PREDECESSOR_BLOCK;

    // If we have a BailOnNoProfile in the first block, there must have been at least one path out of this block that always throws.
    // Don't bother keeping the bailout in the first block as there are some issues in restoring the ArgIn bytecode registers on bailout
    // and throw case should be rare enough that it won't matter for perf.
    if (block->GetBlockNum() != 0)
    {
        blockHeadInstr->isOpHelper = true;
#if DBG
        blockHeadInstr->m_noHelperAssert = true;
#endif

        instr->m_func = curInstr->m_func;

        if (insertionPointForGenerator != nullptr)
        {
            insertionPointForGenerator->InsertAfter(instr);
            block->beginsBailOnNoProfile = false;
        }
        else
        {
            curInstr->InsertAfter(instr);
            block->beginsBailOnNoProfile = true;
        }

        bool setLastInstr = (curInstr == block->GetLastInstr());
        if (setLastInstr)
        {
            block->SetLastInstr(instr);
        }

        if (this->DoMarkTempObjects())
        {
            block->tempObjectTracker->ProcessBailOnNoProfile(instr);
        }
        return false;
    }
    else
    {
        instr->Free();
        return true;
    }
}